

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat4Color
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  Hex<16UL> hex;
  Hex<16UL> hex_00;
  Hex<16UL> hex_01;
  ostringstream *this_00;
  bool bVar1;
  long lVar2;
  Hex<16UL> hex_02;
  long lVar3;
  Hex<16UL> hex_03;
  long lVar4;
  Hex<16UL> hex_04;
  long lVar5;
  Hex<16UL> hex_05;
  Hex<16UL> hex_06;
  StateQueryMemoryWriteGuard<long[4]> floatVector4;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::StateQueryMemoryWriteGuard
            (&floatVector4);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,floatVector4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                    (&floatVector4,testCtx);
  if (bVar1) {
    lVar3 = (long)((reference0 * 4.2949673e+09 + -1.0) * 0.5);
    hex.value = lVar3 - 0x7ff;
    lVar4 = (long)((reference1 * 4.2949673e+09 + -1.0) * 0.5);
    lVar5 = (long)((reference2 * 4.2949673e+09 + -1.0) * 0.5);
    hex_00.value = lVar4 - 0x7ff;
    hex_01.value = lVar5 - 0x7ff;
    lVar2 = (long)((reference3 * 4.2949673e+09 + -1.0) * 0.5);
    hex_06.value = lVar2 - 0x7ff;
    hex_03.value = lVar3 + 0x7ff;
    hex_04.value = lVar4 + 0x7ff;
    hex_05.value = lVar5 + 0x7ff;
    hex_02.value = lVar2 + 0x7ff;
    if (((((long)hex_03.value < floatVector4.m_value[0] || floatVector4.m_value[0] < (long)hex.value
          ) || ((long)hex_04.value < floatVector4.m_value[1] ||
                floatVector4.m_value[1] < (long)hex_00.value)) ||
        ((long)hex_05.value < floatVector4.m_value[2] ||
         floatVector4.m_value[2] < (long)hex_01.value)) ||
       (floatVector4.m_value[3] < (long)hex_06.value || (long)hex_02.value < floatVector4.m_value[3]
       )) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"// ERROR: expected in ranges ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,hex);
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,hex_03);
      std::operator<<((ostream *)this_00,"], ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,hex_00);
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,hex_04);
      std::operator<<((ostream *)this_00,"], ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,hex_01);
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,hex_05);
      std::operator<<((ostream *)this_00,"], ");
      std::operator<<((ostream *)this_00,"[");
      tcu::Format::operator<<((ostream *)this_00,hex_06);
      std::operator<<((ostream *)this_00," ");
      tcu::Format::operator<<((ostream *)this_00,hex_02);
      std::operator<<((ostream *)this_00,"]");
      std::operator<<((ostream *)this_00,"; got ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<16UL>)floatVector4.m_value[0]);
      std::operator<<((ostream *)this_00,", ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<16UL>)floatVector4.m_value[1]);
      std::operator<<((ostream *)this_00,", ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<16UL>)floatVector4.m_value[2]);
      std::operator<<((ostream *)this_00,", ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<16UL>)floatVector4.m_value[3]);
      std::operator<<((ostream *)this_00," ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat4Color (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1, GLfloat reference2, GLfloat reference3)
{
	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 referenceAsGLintMin[] =
	{
		expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference2) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference3) - FLOAT_EXPANSION_E_64
	};
	const GLint64 referenceAsGLintMax[] =
	{
		expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference2) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference3) + FLOAT_EXPANSION_E_64
	};

	StateQueryMemoryWriteGuard<GLint64[4]> floatVector4;
	glGetInteger64v(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if (floatVector4[0] < referenceAsGLintMin[0] || floatVector4[0] > referenceAsGLintMax[0] ||
		floatVector4[1] < referenceAsGLintMin[1] || floatVector4[1] > referenceAsGLintMax[1] ||
		floatVector4[2] < referenceAsGLintMin[2] || floatVector4[2] > referenceAsGLintMax[2] ||
		floatVector4[3] < referenceAsGLintMin[3] || floatVector4[3] > referenceAsGLintMax[3])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "], "
			<< "[" << toHex(referenceAsGLintMin[2]) << " " << toHex(referenceAsGLintMax[2]) << "], "
			<< "[" << toHex(referenceAsGLintMin[3]) << " " << toHex(referenceAsGLintMax[3]) << "]"
			<< "; got "
			<< toHex(floatVector4[0]) << ", "
			<< toHex(floatVector4[1]) << ", "
			<< toHex(floatVector4[2]) << ", "
			<< toHex(floatVector4[3]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}